

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void stbtt__h_prefilter(uchar *pixels,int w,int h,int stride_in_bytes,uint kernel_width)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  uchar buffer [8];
  
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  lVar8 = (long)(int)(w - kernel_width);
  iVar7 = 0;
  if (h < 1) {
    h = iVar7;
  }
  for (; iVar7 != h; iVar7 = iVar7 + 1) {
    memset(buffer,0,(ulong)kernel_width);
    switch(kernel_width) {
    case 2:
      uVar4 = 0;
      for (uVar6 = 0; (long)uVar6 <= lVar8; uVar6 = uVar6 + 1) {
        bVar1 = pixels[uVar6];
        bVar2 = buffer[(uint)uVar6 & 7];
        buffer[(uint)uVar6 + 2 & 7] = bVar1;
        uVar3 = (int)uVar4 + ((uint)bVar1 - (uint)bVar2);
        uVar4 = (ulong)uVar3;
        pixels[uVar6] = (uchar)(uVar3 >> 1);
      }
      break;
    case 3:
      uVar4 = 0;
      for (uVar6 = 0; (long)uVar6 <= lVar8; uVar6 = uVar6 + 1) {
        bVar1 = pixels[uVar6];
        bVar2 = buffer[(uint)uVar6 & 7];
        buffer[(uint)uVar6 + 3 & 7] = bVar1;
        uVar4 = (ulong)((int)uVar4 + ((uint)bVar1 - (uint)bVar2));
        pixels[uVar6] = (uchar)(uVar4 / 3);
      }
      break;
    case 4:
      uVar4 = 0;
      for (uVar6 = 0; (long)uVar6 <= lVar8; uVar6 = uVar6 + 1) {
        bVar1 = pixels[uVar6];
        uVar5 = (ulong)((uint)uVar6 & 7);
        buffer[uVar5 ^ 4] = bVar1;
        uVar3 = (int)uVar4 + ((uint)bVar1 - (uint)buffer[uVar5]);
        uVar4 = (ulong)uVar3;
        pixels[uVar6] = (uchar)(uVar3 >> 2);
      }
      break;
    case 5:
      uVar4 = 0;
      for (uVar6 = 0; (long)uVar6 <= lVar8; uVar6 = uVar6 + 1) {
        bVar1 = pixels[uVar6];
        bVar2 = buffer[(uint)uVar6 & 7];
        buffer[(uint)uVar6 + 5 & 7] = bVar1;
        uVar4 = (ulong)((int)uVar4 + ((uint)bVar1 - (uint)bVar2));
        pixels[uVar6] = (uchar)(uVar4 / 5);
      }
      break;
    default:
      uVar4 = 0;
      for (uVar6 = 0; (long)uVar6 <= lVar8; uVar6 = uVar6 + 1) {
        bVar1 = pixels[uVar6];
        bVar2 = buffer[(uint)uVar6 & 7];
        buffer[kernel_width + (uint)uVar6 & 7] = bVar1;
        uVar3 = (int)uVar4 + ((uint)bVar1 - (uint)bVar2);
        uVar4 = (ulong)uVar3;
        pixels[uVar6] = (uchar)(uVar3 / kernel_width);
      }
    }
    for (uVar6 = uVar6 & 0xffffffff; (long)uVar6 < (long)w; uVar6 = uVar6 + 1) {
      uVar3 = (int)uVar4 - (uint)buffer[(uint)uVar6 & 7];
      uVar4 = (ulong)uVar3;
      pixels[uVar6] = (uchar)(uVar3 / kernel_width);
    }
    pixels = pixels + stride_in_bytes;
  }
  return;
}

Assistant:

static void stbtt__h_prefilter(unsigned char *pixels, int w, int h, int stride_in_bytes, unsigned int kernel_width)
{
unsigned char buffer[STBTT_MAX_OVERSAMPLE];
int safe_w = w - kernel_width;
int j;
STBTT_memset(buffer, 0, STBTT_MAX_OVERSAMPLE); /*  suppress bogus warning from VS2013 -analyze */
for (j=0; j < h; ++j) {
int i;
unsigned int total;
STBTT_memset(buffer, 0, kernel_width);

total = 0;

/*  make kernel_width a constant in common cases so compiler can optimize out the divide */
switch (kernel_width) {
case 2:
for (i=0; i <= safe_w; ++i) {
total += pixels[i] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
pixels[i] = (unsigned char) (total / 2);
}
break;
case 3:
for (i=0; i <= safe_w; ++i) {
total += pixels[i] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
pixels[i] = (unsigned char) (total / 3);
}
break;
case 4:
for (i=0; i <= safe_w; ++i) {
total += pixels[i] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
pixels[i] = (unsigned char) (total / 4);
}
break;
case 5:
for (i=0; i <= safe_w; ++i) {
total += pixels[i] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
pixels[i] = (unsigned char) (total / 5);
}
break;
default:
for (i=0; i <= safe_w; ++i) {
total += pixels[i] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
pixels[i] = (unsigned char) (total / kernel_width);
}
break;
}

for (; i < w; ++i) {
STBTT_assert(pixels[i] == 0);
total -= buffer[i & STBTT__OVER_MASK];
pixels[i] = (unsigned char) (total / kernel_width);
}

pixels += stride_in_bytes;
}
}